

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GenerateVisitCode
          (ImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Printer *printer_local;
  ImmutableStringFieldLiteGenerator *this_local;
  
  descriptor = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportFieldPresence(descriptor);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "$name$_ = visitor.visitString(\n    has$capitalized_name$(), $name$_,\n    other.has$capitalized_name$(), other.$name$_);\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "$name$_ = visitor.visitString(!$name$_.isEmpty(), $name$_,\n    !other.$name$_.isEmpty(), other.$name$_);\n"
                      );
  }
  return;
}

Assistant:

void ImmutableStringFieldLiteGenerator::
GenerateVisitCode(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    printer->Print(variables_,
      "$name$_ = visitor.visitString(\n"
      "    has$capitalized_name$(), $name$_,\n"
      "    other.has$capitalized_name$(), other.$name$_);\n");
  } else {
    printer->Print(variables_,
      "$name$_ = visitor.visitString(!$name$_.isEmpty(), $name$_,\n"
      "    !other.$name$_.isEmpty(), other.$name$_);\n");
  }
}